

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O2

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FT_Byte *pFVar9;
  FT_UInt FVar10;
  FT_Byte *pFVar11;
  FT_Byte *pFVar12;
  FT_ULong key0;
  ulong uVar13;
  uint *puVar14;
  bool bVar15;
  
  pFVar11 = face->kern_table;
  if (pFVar11 == (FT_Byte *)0x0) {
    iVar4 = 0;
  }
  else {
    pFVar9 = pFVar11 + face->kern_table_size;
    FVar10 = face->num_kern_tables;
    uVar13 = (ulong)right_glyph | (ulong)left_glyph << 0x10;
    uVar6 = 1;
    iVar4 = 0;
    pFVar11 = pFVar11 + 4;
    while ((bVar15 = FVar10 != 0, FVar10 = FVar10 - 1, bVar15 && (pFVar11 + 6 <= pFVar9))) {
      pFVar12 = pFVar11 + (ushort)(*(ushort *)(pFVar11 + 2) << 8 | *(ushort *)(pFVar11 + 2) >> 8);
      if (pFVar9 < pFVar11 + (ushort)(*(ushort *)(pFVar11 + 2) << 8 | *(ushort *)(pFVar11 + 2) >> 8)
         ) {
        pFVar12 = pFVar9;
      }
      if (((face->kern_avail_bits & uVar6) != 0) && (pFVar11[4] == '\0')) {
        puVar14 = (uint *)(pFVar11 + 0xe);
        uVar8 = (uint)(ushort)(*(ushort *)(pFVar11 + 6) << 8 | *(ushort *)(pFVar11 + 6) >> 8);
        uVar3 = ((long)pFVar12 - (long)puVar14) / 6 & 0xffffffff;
        if ((long)(ulong)(uVar8 * 6) <= (long)pFVar12 - (long)puVar14) {
          uVar3 = (ulong)uVar8;
        }
        if ((face->kern_order_bits & uVar6) != 0) {
          uVar8 = 0;
LAB_00206efa:
          if (uVar8 < (uint)uVar3) {
            uVar7 = (uint)uVar3 + uVar8 >> 1;
            uVar1 = *(uint *)((long)puVar14 + (ulong)(uVar7 * 6));
            uVar5 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18);
            if (uVar5 != uVar13) goto code_r0x00206f12;
            puVar14 = (uint *)((long)puVar14 + (ulong)(uVar7 * 6));
LAB_00206f37:
            if ((pFVar11[5] & 8) != 0) {
              iVar4 = 0;
            }
            iVar4 = iVar4 + ((int)(short)((ushort)(byte)puVar14[1] << 8) |
                            (uint)*(byte *)((long)puVar14 + 5));
          }
          goto LAB_00206f57;
        }
        while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
          uVar8 = *puVar14;
          if ((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18) ==
              uVar13) goto LAB_00206f37;
          puVar14 = (uint *)((long)puVar14 + 6);
        }
      }
LAB_00206f57:
      uVar6 = uVar6 * 2;
      pFVar11 = pFVar12;
    }
  }
  return iVar4;
code_r0x00206f12:
  if (uVar5 < uVar13) {
    uVar8 = uVar7 + 1;
  }
  else {
    uVar3 = (ulong)uVar7;
  }
  goto LAB_00206efa;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int   result = 0;
    FT_UInt  count, mask;

    FT_Byte*  p;
    FT_Byte*  p_limit;


    if ( !face->kern_table )
      return result;

    p       = face->kern_table;
    p_limit = p + face->kern_table_size;

    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        * We don't support format 2 because we haven't seen a single font
        * using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }